

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

ostream * embree::emitXML(ostream *cout,Ref<embree::XML> *xml,size_t depth)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  const_iterator depth_00;
  pointer ppVar3;
  size_type sVar4;
  ostream *poVar5;
  Ref<embree::XML> *in_RDX;
  ostream *in_RSI;
  char *pcVar6;
  ostream *in_RDI;
  size_t i_2;
  size_t i_1;
  bool compact;
  const_iterator i;
  ostream *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  ostream *local_c0;
  ulong local_b8;
  _Self local_a0;
  ostream *local_78;
  
  if (in_RDX == (Ref<embree::XML> *)0x0) {
    poVar2 = std::operator<<(in_RDI,"<?xml version=\"1.0\"?>");
    this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  indent(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
  poVar2 = std::operator<<(in_RDI,"<");
  std::operator<<(poVar2,(string *)(*(long *)in_RSI + 0x30));
  depth_00 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffef8);
  while( true ) {
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffef8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff68,&local_a0);
    if (!bVar1) break;
    poVar2 = std::operator<<(in_RDI," ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x437bb0);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2,"=");
    poVar2 = std::operator<<(poVar2,"\"");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x437bea);
    poVar2 = std::operator<<(poVar2,(string *)&ppVar3->second);
    std::operator<<(poVar2,"\"");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  sVar4 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                    ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(*(long *)in_RSI + 0x80));
  if ((sVar4 == 0) &&
     (sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                         (*(long *)in_RSI + 0x98)), sVar4 == 0)) {
    poVar2 = std::operator<<(in_RDI,"/>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_78 = in_RDI;
  }
  else {
    std::operator<<(in_RDI,">");
    sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                      ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                       (*(long *)in_RSI + 0x98));
    bVar1 = false;
    if (sVar4 < 0x10) {
      sVar4 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
              size((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                   (*(long *)in_RSI + 0x80));
      bVar1 = sVar4 == 0;
    }
    if (!bVar1) {
      std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
    }
    sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                      ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                       (*(long *)in_RSI + 0x98));
    if (sVar4 != 0) {
      if (!bVar1) {
        indent(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      }
      for (local_b8 = 0;
          sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                            ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                             (*(long *)in_RSI + 0x98)), local_b8 < sVar4; local_b8 = local_b8 + 1) {
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*(long *)in_RSI + 0x98)
                   ,local_b8);
        poVar2 = operator<<(in_stack_fffffffffffffef8,(Token *)0x437e32);
        sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                          ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                           (*(long *)in_RSI + 0x98));
        pcVar6 = "";
        if (local_b8 != sVar4 - 1) {
          pcVar6 = " ";
        }
        std::operator<<(poVar2,pcVar6);
      }
      if (!bVar1) {
        std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
      }
    }
    local_c0 = (ostream *)0x0;
    while (poVar2 = local_c0,
          poVar5 = (ostream *)
                   std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ::size((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                           *)(*(long *)in_RSI + 0x80)), poVar2 < poVar5) {
      in_stack_fffffffffffffef8 = in_RDI;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*(long *)in_RSI + 0x80),(size_type)local_c0);
      emitXML(in_RSI,in_RDX,(size_t)depth_00._M_node);
      local_c0 = local_c0 + 1;
    }
    if (!bVar1) {
      indent(poVar2,(size_t)in_stack_fffffffffffffef8);
    }
    poVar2 = std::operator<<(in_RDI,"</");
    poVar2 = std::operator<<(poVar2,(string *)(*(long *)in_RSI + 0x30));
    poVar2 = std::operator<<(poVar2,">");
    local_78 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return local_78;
}

Assistant:

std::ostream& emitXML(std::ostream& cout, const Ref<XML>& xml, size_t depth = 0)
  {
    /* print header */
    if (depth == 0) cout << "<?xml version=\"1.0\"?>" << std::endl << std::endl;

    /* print tag opening */
    indent(cout,depth); cout << "<" << xml->name;
    for (std::map<std::string,std::string>::const_iterator i=xml->parms.begin(); i!=xml->parms.end(); i++)
      cout << " " << i->first << "=" << "\"" << i->second << "\"";
    if (xml->children.size() == 0 && xml->body.size() == 0) {
      cout << "/>" << std::endl;
      return cout;
    }
    cout << ">";

    bool compact = xml->body.size() < 16 && xml->children.size() == 0;
    if (!compact) cout << std::endl;

    /* print token list */
    if (xml->body.size()) {
      if (!compact) indent(cout,depth+1);
      for (size_t i=0; i<xml->body.size(); i++)
        cout << xml->body[i] << (i!=xml->body.size()-1?" ":"");
      if (!compact) cout << std::endl;
    }

    /* print children */
    for (size_t i=0; i<xml->children.size(); i++)
      emitXML(cout,xml->children[i],depth+1);

    /* print tag closing */
    if (!compact) indent(cout,depth);
    return cout << "</" << xml->name << ">" << std::endl;
  }